

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

string * __thiscall MetaCommand::ExtractDateFromCVS(MetaCommand *this,string *date)

{
  long lVar1;
  char *pcVar2;
  ulong in_RDX;
  string *in_RDI;
  uint i;
  string *newdate;
  undefined4 local_20;
  
  std::__cxx11::string::string((string *)in_RDI);
  for (local_20 = 7; lVar1 = std::__cxx11::string::size(), (ulong)local_20 < lVar1 - 1U;
      local_20 = local_20 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDX);
    std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2);
  }
  return in_RDI;
}

Assistant:

METAIO_STL::string MetaCommand::ExtractDateFromCVS(METAIO_STL::string date)
{
  METAIO_STL::string newdate;
  for(unsigned int i=7; i < date.size()-1; ++i)
    {
    newdate += date[i];
    }
  return newdate;
}